

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void set_block_thresholds(AV1_COMMON *cm,RD_OPT *rd,int use_nonrd_pick_mode)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int mode_index;
  int thresh_max;
  int t;
  int q;
  int qindex;
  MV_REFERENCE_FRAME ref;
  int r_idx;
  int num_modes_count;
  THR_MODES mode_indices [16];
  int segment_id;
  int bsize;
  int i;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  THR_MODES (*in_stack_ffffffffffffff98) [4];
  THR_MODES (*in_stack_ffffffffffffffa0) [4];
  int local_40;
  int local_3c;
  byte local_38 [24];
  int local_20;
  int local_1c;
  uint local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_38,0,0x10);
  local_3c = 0xa9;
  if (local_14 != 0) {
    local_3c = 0;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      cVar1 = real_time_ref_combos[local_40][0];
      if (cVar1 == '\0') {
        for (local_18 = 0; (int)local_18 < 4; local_18 = local_18 + 1) {
          in_stack_ffffffffffffff98 = mode_idx;
          iVar3 = mode_offset(""[(int)local_18]);
          local_38[local_3c] =
               *(byte *)((long)(((segmentation *)in_stack_ffffffffffffff98)->feature_data + -1) +
                         0xc + (long)iVar3);
          local_3c = local_3c + 1;
        }
      }
      else {
        for (local_18 = 0; (int)local_18 < 4; local_18 = local_18 + 1) {
          in_stack_ffffffffffffffa0 = mode_idx + cVar1;
          iVar3 = mode_offset("\r\x0e\x0f\x10"[(int)local_18]);
          local_38[local_3c] = (*in_stack_ffffffffffffffa0)[iVar3];
          local_3c = local_3c + 1;
        }
      }
    }
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    iVar3 = av1_get_qindex((segmentation *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                           in_stack_ffffffffffffff90);
    clamp(iVar3 + *(int *)(local_8 + 0x270),0,0xff);
    iVar3 = compute_rd_thresh_factor
                      ((int)in_stack_ffffffffffffffa0,
                       (aom_bit_depth_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
      bVar2 = "\x02\x03\x03\x04\x06\x06\b\f\f\x10\x18\x18 00@\x04\x04\b\b\x10\x10"[local_1c];
      for (local_18 = 0; (int)local_18 < local_3c; local_18 = local_18 + 1) {
        in_stack_ffffffffffffff94 = local_18;
        if (local_14 != 0) {
          in_stack_ffffffffffffff94 = (uint)local_38[(int)local_18];
        }
        if (*(int *)(local_10 + (long)(int)in_stack_ffffffffffffff94 * 4) <
            (int)(0x7fffffff / (long)(int)(iVar3 * (uint)bVar2))) {
          in_stack_ffffffffffffff90 =
               (int)(*(int *)(local_10 + (long)(int)in_stack_ffffffffffffff94 * 4) *
                    iVar3 * (uint)bVar2) / 4;
        }
        else {
          in_stack_ffffffffffffff90 = 0x7fffffff;
        }
        *(int *)(local_10 + 0x2a4 + (long)local_20 * 0x3a18 + (long)local_1c * 0x2a4 +
                (long)(int)in_stack_ffffffffffffff94 * 4) = in_stack_ffffffffffffff90;
      }
    }
  }
  return;
}

Assistant:

static void set_block_thresholds(const AV1_COMMON *cm, RD_OPT *rd,
                                 int use_nonrd_pick_mode) {
  int i, bsize, segment_id;
  THR_MODES mode_indices[RTC_REFS * RTC_MODES] = { 0 };
  int num_modes_count = use_nonrd_pick_mode ? 0 : MAX_MODES;

  if (use_nonrd_pick_mode) {
    for (int r_idx = 0; r_idx < RTC_REFS; r_idx++) {
      const MV_REFERENCE_FRAME ref = real_time_ref_combos[r_idx][0];
      if (ref != INTRA_FRAME) {
        for (i = 0; i < RTC_INTER_MODES; i++)
          mode_indices[num_modes_count++] =
              mode_idx[ref][mode_offset(inter_mode_list[i])];
      } else {
        for (i = 0; i < RTC_INTRA_MODES; i++)
          mode_indices[num_modes_count++] =
              mode_idx[ref][mode_offset(intra_mode_list[i])];
      }
    }
  }

  for (segment_id = 0; segment_id < MAX_SEGMENTS; ++segment_id) {
    const int qindex = clamp(
        av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex) +
            cm->quant_params.y_dc_delta_q,
        0, MAXQ);
    const int q = compute_rd_thresh_factor(qindex, cm->seq_params->bit_depth);

    for (bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      // Threshold here seems unnecessarily harsh but fine given actual
      // range of values used for cpi->sf.thresh_mult[].
      const int t = q * rd_thresh_block_size_factor[bsize];
      const int thresh_max = INT_MAX / t;

      for (i = 0; i < num_modes_count; ++i) {
        const int mode_index = use_nonrd_pick_mode ? mode_indices[i] : i;
        rd->threshes[segment_id][bsize][mode_index] =
            rd->thresh_mult[mode_index] < thresh_max
                ? rd->thresh_mult[mode_index] * t / 4
                : INT_MAX;
      }
    }
  }
}